

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

bool __thiscall capnp::anon_unknown_69::WindowFlowController::isReady(WindowFlowController *this)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  
  uVar1 = this->inFlight;
  bVar3 = true;
  if (this->maxMessageSize < uVar1) {
    iVar2 = (**this->windowGetter->_vptr_WindowGetter)();
    bVar3 = uVar1 < CONCAT44(extraout_var,iVar2) + this->maxMessageSize;
  }
  return bVar3;
}

Assistant:

bool isReady() {
    // We extend the window by maxMessageSize to avoid a pathological situation when a message
    // is larger than the window size. Otherwise, after sending that message, we would end up
    // not sending any others until the ack was received, wasting a round trip's worth of
    // bandwidth.
    return inFlight <= maxMessageSize  // avoid getWindow() call if unnecessary
        || inFlight < windowGetter.getWindow() + maxMessageSize;
  }